

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzmatrix.cpp
# Opt level: O1

void __thiscall
TPZMatrix<std::complex<double>_>::Diagonal
          (TPZMatrix<std::complex<double>_> *this,complex<double> val)

{
  undefined8 *puVar1;
  long lVar2;
  long lVar3;
  undefined8 local_48 [2];
  undefined8 local_38;
  undefined8 uStack_30;
  
  if ((this->super_TPZBaseMatrix).fCol != (this->super_TPZBaseMatrix).fRow) {
    Error("Diagonal (TPZMatrix<>*) <TPZMatrix<>must be square>",(char *)0x0);
  }
  if (0 < (this->super_TPZBaseMatrix).fRow) {
    lVar2 = 0;
    do {
      if (0 < (this->super_TPZBaseMatrix).fCol) {
        lVar3 = 0;
        do {
          puVar1 = local_48;
          if (lVar2 != lVar3) {
            local_38 = 0;
            uStack_30 = 0;
            puVar1 = &local_38;
          }
          (*(this->super_TPZBaseMatrix).super_TPZSavable._vptr_TPZSavable[0x23])
                    (this,lVar2,lVar3,puVar1);
          lVar3 = lVar3 + 1;
        } while (lVar3 < (this->super_TPZBaseMatrix).fCol);
      }
      lVar2 = lVar2 + 1;
    } while (lVar2 < (this->super_TPZBaseMatrix).fRow);
  }
  return;
}

Assistant:

void TPZMatrix<TVar>::Diagonal(TVar val) {
    
    if ( Cols() != Rows() ) {
        Error( "Diagonal (TPZMatrix<>*) <TPZMatrix<>must be square>" );
    }
    for ( int64_t row = 0; row < Rows(); row++) {
        for ( int64_t col = 0; col < Cols(); col++ ) {
            (row == col)? PutVal(row,col,val):PutVal(row,col,0.);
        }
    }
}